

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O0

void blockfilter_tests::blockfilters_json_test_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  blockfilters_json_test t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff628;
  std_string *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff638;
  const_string *in_stack_fffffffffffff650;
  const_string *msg;
  size_t in_stack_fffffffffffff658;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff660;
  unit_test_log_t *in_stack_fffffffffffff668;
  undefined1 local_800 [128];
  blockfilters_json_test *in_stack_fffffffffffff880;
  undefined1 local_668 [408];
  undefined1 local_4d0 [408];
  undefined1 local_338 [408];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [23])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [15])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_338,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [23])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [16])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::setup_conditional<blockfilter_tests::blockfilters_json_test>
            ((blockfilters_json_test *)0x479f3f);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_4d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [23])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [13])in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  blockfilters_json_test::test_method(in_stack_fffffffffffff880);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  memset(local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [23])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [19])in_stack_fffffffffffff630);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::unit_test::teardown_conditional<blockfilter_tests::blockfilters_json_test>
            ((blockfilters_json_test *)0x47a15c);
  msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff638,
             (pointer)in_stack_fffffffffffff630,(unsigned_long)in_stack_fffffffffffff628);
  __s = local_800;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff628);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff628);
  file = boost::operator<<(in_stack_fffffffffffff638,(char *)in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [23])in_stack_fffffffffffff630);
  boost::operator<<(in_stack_fffffffffffff638,(char (*) [15])in_stack_fffffffffffff630);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff638);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_fffffffffffff630);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)__s,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff628);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilters_json_test)
{
    UniValue json;
    if (!json.read(json_tests::blockfilters) || !json.isArray()) {
        BOOST_ERROR("Parse error.");
        return;
    }

    const UniValue& tests = json.get_array();
    for (unsigned int i = 0; i < tests.size(); i++) {
        const UniValue& test = tests[i];
        std::string strTest = test.write();

        if (test.size() == 1) {
            continue;
        } else if (test.size() < 7) {
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }

        unsigned int pos = 0;
        /*int block_height =*/ test[pos++].getInt<int>();
        BOOST_CHECK(uint256::FromHex(test[pos++].get_str()));

        CBlock block;
        BOOST_REQUIRE(DecodeHexBlk(block, test[pos++].get_str()));

        CBlockUndo block_undo;
        block_undo.vtxundo.emplace_back();
        CTxUndo& tx_undo = block_undo.vtxundo.back();
        const UniValue& prev_scripts = test[pos++].get_array();
        for (unsigned int ii = 0; ii < prev_scripts.size(); ii++) {
            std::vector<unsigned char> raw_script = ParseHex(prev_scripts[ii].get_str());
            CTxOut txout(0, CScript(raw_script.begin(), raw_script.end()));
            tx_undo.vprevout.emplace_back(txout, 0, false);
        }

        uint256 prev_filter_header_basic{*Assert(uint256::FromHex(test[pos++].get_str()))};
        std::vector<unsigned char> filter_basic = ParseHex(test[pos++].get_str());
        uint256 filter_header_basic{*Assert(uint256::FromHex(test[pos++].get_str()))};

        BlockFilter computed_filter_basic(BlockFilterType::BASIC, block, block_undo);
        BOOST_CHECK(computed_filter_basic.GetFilter().GetEncoded() == filter_basic);

        uint256 computed_header_basic = computed_filter_basic.ComputeHeader(prev_filter_header_basic);
        BOOST_CHECK(computed_header_basic == filter_header_basic);
    }
}